

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*> *this_00;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  **ppRVar1;
  Impl *pIVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  Type *pTVar8;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  *pRVar9;
  byte bVar10;
  ArrayPtr<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry> table;
  Fault local_88;
  size_t local_80;
  Type local_78;
  SegmentReader *local_68;
  CapTableReader *pCStack_60;
  void *local_58;
  WirePointer *pWStack_50;
  StructDataBitCount local_48;
  StructPointerCount SStack_44;
  undefined2 uStack_42;
  int iStack_40;
  undefined4 uStack_3c;
  HandlerBase *local_38;
  Type local_30;
  
  local_30.field_4 = type.field_4;
  local_30._0_8_ = type._0_8_;
  bVar10 = 0;
  local_78 = StructSchema::Field::getType(&field);
  bVar5 = Type::operator==(&local_30,&local_78);
  if (!bVar5) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
              ((Fault *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x36b,FAILED,"type == field.getType()",
               "\"handler type did not match field type for addFieldHandler()\"",
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal((Fault *)&local_78);
  }
  pIVar2 = (this->impl).ptr;
  local_48 = field.proto._reader.dataSize;
  SStack_44 = field.proto._reader.pointerCount;
  uStack_42 = field.proto._reader._38_2_;
  iStack_40 = field.proto._reader.nestingLimit;
  uStack_3c = field.proto._reader._44_4_;
  local_58 = field.proto._reader.data;
  pWStack_50 = field.proto._reader.pointers;
  local_68 = field.proto._reader.segment;
  pCStack_60 = field.proto._reader.capTable;
  local_78.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)field._8_8_;
  local_78._0_8_ = field.parent.super_Schema.raw;
  pEVar3 = (pIVar2->fieldHandlers).table.rows.builder.ptr;
  sVar6 = ((long)(pIVar2->fieldHandlers).table.rows.builder.pos - (long)pEVar3 >> 3) *
          -0x71c71c71c71c71c7;
  table.size_ = (size_t)pEVar3;
  table.ptr = (Entry *)&(pIVar2->fieldHandlers).table.indexes;
  local_38 = handler;
  kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
  insert<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,capnp::StructSchema::Field&>
            ((HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
              *)&local_88,table,sVar6,(Field *)sVar6);
  if (local_88.exception._0_1_ ==
      (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>)
      0x1) {
    sVar6 = local_80;
  }
  this_00 = &pIVar2->fieldHandlers;
  if (local_88.exception._0_1_ ==
      (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>)
      0x0) {
    pEVar3 = (pIVar2->fieldHandlers).table.rows.builder.endPtr;
    if ((pIVar2->fieldHandlers).table.rows.builder.pos == pEVar3) {
      pEVar4 = (this_00->table).rows.builder.ptr;
      sVar6 = 4;
      if (pEVar3 != pEVar4) {
        sVar6 = ((long)pEVar3 - (long)pEVar4 >> 3) * 0x1c71c71c71c71c72;
      }
      kj::Vector<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>::
      setCapacity((Vector<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                   *)this_00,sVar6);
    }
    pTVar8 = &local_78;
    pRVar9 = (pIVar2->fieldHandlers).table.rows.builder.pos;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pRVar9->key).parent.super_Schema.raw = *(RawBrandedSchema **)pTVar8;
      pTVar8 = (Type *)&pTVar8[-(ulong)bVar10].field_4;
      pRVar9 = (RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                *)((long)pRVar9 + (ulong)bVar10 * -0x10 + 8);
    }
    ppRVar1 = &(pIVar2->fieldHandlers).table.rows.builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  else if ((this_00->table).rows.builder.ptr[sVar6].value != local_38) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x36d,FAILED,"existing == replacement",
               "\"field already has a different registered handler\"",
               (char (*) [49])"field already has a different registered handler");
    kj::_::Debug::Fault::fatal(&local_88);
  }
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}